

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O2

void __thiscall duckdb::CSVErrorHandler::ErrorIfNeeded(CSVErrorHandler *this)

{
  bool bVar1;
  reference pvVar2;
  undefined8 extraout_RAX;
  
  ::std::mutex::lock(&this->main_mutex);
  if ((this->ignore_errors == false) &&
     ((this->errors).super_vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>.
      super__Vector_base<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->errors).super_vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>.
      super__Vector_base<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    pvVar2 = vector<duckdb::CSVError,_true>::get<true>(&this->errors,0);
    bVar1 = CanGetLine(this,(pvVar2->error_info).boundary_idx);
    if (bVar1) {
      pvVar2 = vector<duckdb::CSVError,_true>::get<true>(&this->errors,0);
      ThrowError(this,pvVar2);
      pthread_mutex_unlock((pthread_mutex_t *)this);
      _Unwind_Resume(extraout_RAX);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void CSVErrorHandler::ErrorIfNeeded() {
	lock_guard<mutex> parallel_lock(main_mutex);
	if (ignore_errors || errors.empty()) {
		// Nothing to error
		return;
	}

	if (CanGetLine(errors[0].error_info.boundary_idx)) {
		ThrowError(errors[0]);
	}
}